

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O1

size_t absl::lts_20250127::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::FileDescriptor_const*>
                 (void *fn,void *slot)

{
  uint64_t uVar1;
  ulong uVar2;
  uint64_t v;
  
  uVar2 = (*(undefined8 **)(*slot + 8))[1];
  uVar1 = hash_internal::MixingHashState::CombineContiguousImpl
                    (&hash_internal::MixingHashState::kSeed,**(undefined8 **)(*slot + 8),uVar2);
  uVar2 = (uVar1 ^ uVar2) * -0x234dd359734ecb13;
  return uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}